

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageModule.cpp
# Opt level: O1

MessageTemplate * __thiscall
ki::protocol::dml::MessageModule::get_message_template(MessageModule *this,string *name)

{
  const_iterator cVar1;
  mapped_type *ppMVar2;
  mapped_type pMVar3;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageTemplate_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageTemplate_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageTemplate_*>_>_>
          ::find(&(this->m_message_name_map)._M_t,name);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->m_message_name_map)._M_t._M_impl.super__Rb_tree_header) {
    pMVar3 = (MessageTemplate *)0x0;
  }
  else {
    ppMVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageTemplate_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageTemplate_*>_>_>
              ::at(&this->m_message_name_map,name);
    pMVar3 = *ppMVar2;
  }
  return pMVar3;
}

Assistant:

const MessageTemplate *MessageModule::get_message_template(std::string name) const
	{
		if (m_message_name_map.count(name) == 1)
			return m_message_name_map.at(name);
		return nullptr;
	}